

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void stripspe(obj *obj)

{
  char *pcVar1;
  char *pcVar2;
  
  if (((obj->field_0x4a & 2) == 0) && ('\0' < obj->spe)) {
    obj->spe = '\0';
    if ((ushort)(obj->otyp - 0xe7U) < 2) {
      obj->age = 0;
    }
    pcVar1 = xname(obj);
    pcVar2 = otense(obj,"vibrate");
    pline("Your %s %s briefly.",pcVar1,pcVar2);
    return;
  }
  pline("Nothing happens.");
  return;
}

Assistant:

static void stripspe(struct obj *obj)
{
	if (obj->blessed) pline("Nothing happens.");
	else {
		if (obj->spe > 0) {
		    obj->spe = 0;
		    if (obj->otyp == OIL_LAMP || obj->otyp == BRASS_LANTERN)
			obj->age = 0;
		    pline("Your %s %s briefly.",xname(obj), otense(obj, "vibrate"));
		} else pline("Nothing happens.");
	}
}